

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O2

void __thiscall ConditionMarker::~ConditionMarker(ConditionMarker *this)

{
  Varnode *pVVar1;
  pointer ppVVar2;
  
  this->basevn->flags = this->basevn->flags & 0xfffffffe;
  pVVar1 = this->boolvn;
  if (pVVar1 != (Varnode *)0x0) {
    *(byte *)&pVVar1->flags = (byte)pVVar1->flags & 0xfe;
  }
  pVVar1 = this->bool2vn;
  if (pVVar1 != (Varnode *)0x0) {
    *(byte *)&pVVar1->flags = (byte)pVVar1->flags & 0xfe;
  }
  pVVar1 = this->bool3vn;
  if (pVVar1 != (Varnode *)0x0) {
    *(byte *)&pVVar1->flags = (byte)pVVar1->flags & 0xfe;
  }
  if (this->binaryop != (PcodeOp *)0x0) {
    ppVVar2 = (this->binaryop->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pVVar1 = *ppVVar2;
    pVVar1->flags = pVVar1->flags & 0xfffffffe;
    pVVar1 = ppVVar2[1];
    pVVar1->flags = pVVar1->flags & 0xfffffffe;
  }
  return;
}

Assistant:

ConditionMarker::~ConditionMarker(void)

{
  basevn->clearMark();
  if (boolvn != (Varnode *)0)
    boolvn->clearMark();
  if (bool2vn != (Varnode *)0)
    bool2vn->clearMark();
  if (bool3vn != (Varnode *)0)
    bool3vn->clearMark();
  if (binaryop != (PcodeOp *)0) {
    binaryop->getIn(0)->clearMark();
    binaryop->getIn(1)->clearMark();
  }
}